

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

string * __thiscall
args::CompletionFlag::Get_abi_cxx11_(string *__return_storage_ptr__,CompletionFlag *this)

{
  string *in_RCX;
  allocator<char> local_31;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"\n",&local_31);
  detail::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (__return_storage_ptr__,(detail *)(this + 0x110),&local_30,in_RCX);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string Get() noexcept
            {
                return detail::Join(reply, "\n");
            }